

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_lex(lua_State *L,GCstr *src,char *tok,BCLine line,ErrMsg em,__va_list_tag *argp)

{
  char *pcVar1;
  char buff [60];
  char acStack_78 [72];
  
  lj_debug_shortname(acStack_78,src,line);
  pcVar1 = lj_strfmt_pushvf(L,lj_err_allmsg + (int)em,argp);
  pcVar1 = lj_strfmt_pushf(L,"%s:%d: %s",acStack_78,(ulong)(uint)line,pcVar1);
  if (tok != (char *)0x0) {
    lj_strfmt_pushf(L,lj_err_allmsg + 0x86e,pcVar1,tok);
  }
  lj_err_throw(L,3);
}

Assistant:

LJ_NOINLINE void lj_err_lex(lua_State *L, GCstr *src, const char *tok,
			    BCLine line, ErrMsg em, va_list argp)
{
  char buff[LUA_IDSIZE];
  const char *msg;
  lj_debug_shortname(buff, src, line);
  msg = lj_strfmt_pushvf(L, err2msg(em), argp);
  msg = lj_strfmt_pushf(L, "%s:%d: %s", buff, line, msg);
  if (tok)
    lj_strfmt_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tok);
  lj_err_throw(L, LUA_ERRSYNTAX);
}